

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_mapper_posix.cpp
# Opt level: O2

shared_ptr<unsigned_char> __thiscall pstore::aligned_valloc(pstore *this,size_t size,uint align)

{
  void *pvVar1;
  undefined8 *puVar2;
  int *piVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  size_t __len;
  ulong uVar4;
  shared_ptr<unsigned_char> sVar5;
  __allocator_type __a2;
  __allocated_ptr<std::allocator<std::_Sp_counted_deleter<unsigned_char_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_lib_os_memory_mapper_posix_cpp:77:30),_std::allocator<void>,_(__gnu_cxx::_Lock_policy)2>_>_>
  local_30;
  
  __len = size + (align - 1);
  pvVar1 = mmap((void *)0x0,__len,3,0x22,-1,0);
  if (pvVar1 != (void *)0x0) {
    uVar4 = -(ulong)align & (long)pvVar1 + ((ulong)align - 1);
    *(ulong *)this = uVar4;
    *(undefined8 *)(this + 8) = 0;
    puVar2 = (undefined8 *)operator_new(0x28);
    local_30._M_alloc = &__a2;
    puVar2[1] = 0x100000001;
    *puVar2 = &PTR___Sp_counted_base_00231b48;
    puVar2[2] = pvVar1;
    puVar2[3] = __len;
    puVar2[4] = uVar4;
    *(undefined8 **)(this + 8) = puVar2;
    local_30._M_ptr = (pointer)0x0;
    std::
    __allocated_ptr<std::allocator<std::_Sp_counted_deleter<unsigned_char_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/os/memory_mapper_posix.cpp:77:30),_std::allocator<void>,_(__gnu_cxx::_Lock_policy)2>_>_>
    ::~__allocated_ptr(&local_30);
    sVar5.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    sVar5.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (shared_ptr<unsigned_char>)
           sVar5.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>;
  }
  piVar3 = __errno_location();
  raise<pstore::errno_erc,char[5]>((errno_erc)*piVar3,(char (*) [5])"mmap");
}

Assistant:

std::shared_ptr<std::uint8_t> aligned_valloc (std::size_t size, unsigned const align) {
        size += align - 1U;

        void * const ptr =
            ::mmap (nullptr, size, PROT_READ | PROT_WRITE, MAP_PRIVATE | MAP_ANONYMOUS, -1, 0);
        if (ptr == nullptr) {
            raise (pstore::errno_erc{errno}, "mmap");
        }

        auto const deleter = [ptr, size] (std::uint8_t * const) { ::munmap (ptr, size); };
        auto const mask = ~(std::uintptr_t{align} - 1);
        auto * const ptr_aligned = reinterpret_cast<std::uint8_t *> (
            (reinterpret_cast<std::uintptr_t> (ptr) + align - 1) & mask);
        return std::shared_ptr<std::uint8_t> (ptr_aligned, deleter);
    }